

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

void GD::predict<true,true>(gd *g,base_learner *param_2,example *ec)

{
  vw *all;
  float fVar1;
  trunc_data local_20;
  
  all = g->all;
  local_20.gravity = (float)all->sd->gravity;
  local_20.prediction = (ec->l).simple.initial;
  foreach_feature<GD::trunc_data,_float_&,_&GD::vec_add_trunc>(all,ec,&local_20);
  ec->partial_prediction = local_20.prediction;
  fVar1 = (float)all->sd->contraction * local_20.prediction;
  ec->partial_prediction = fVar1;
  fVar1 = finalize_prediction(all->sd,fVar1);
  (ec->pred).scalar = fVar1;
  print_audit_features(all,ec);
  return;
}

Assistant:

void predict(gd& g, base_learner&, example& ec)
{
  vw& all = *g.all;
  if (l1)
    ec.partial_prediction = trunc_predict(all, ec, all.sd->gravity);
  else
    ec.partial_prediction = inline_predict(all, ec);

  ec.partial_prediction *= (float)all.sd->contraction;
  ec.pred.scalar = finalize_prediction(all.sd, ec.partial_prediction);
  if (audit)
    print_audit_features(all, ec);
}